

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_ctrl.c
# Opt level: O0

int EVP_PKEY_CTX_set_dh_paramgen_subprime_len(EVP_PKEY_CTX *ctx,int qbits)

{
  int in_ESI;
  size_t bits2;
  OSSL_PARAM *p;
  OSSL_PARAM params [2];
  int ret;
  EVP_PKEY_CTX *in_stack_ffffffffffffff28;
  OSSL_PARAM *pOVar1;
  char *in_stack_ffffffffffffff30;
  EVP_PKEY_CTX *in_stack_ffffffffffffff38;
  undefined1 local_a0 [40];
  long local_78;
  OSSL_PARAM *local_70;
  size_t local_68 [10];
  int local_18;
  int local_4;
  
  local_70 = (OSSL_PARAM *)local_68;
  local_78 = (long)in_ESI;
  local_18 = dh_paramgen_check(in_stack_ffffffffffffff28);
  pOVar1 = local_70;
  local_4 = local_18;
  if (0 < local_18) {
    local_70 = (OSSL_PARAM *)((long)local_70 + 0x28);
    OSSL_PARAM_construct_size_t(in_stack_ffffffffffffff30,(size_t *)pOVar1);
    memcpy(pOVar1,local_a0,0x28);
    pOVar1 = local_70;
    OSSL_PARAM_construct_end();
    memcpy(pOVar1,&stack0xffffffffffffff38,0x28);
    local_4 = evp_pkey_ctx_set_params_strict(in_stack_ffffffffffffff38,pOVar1);
  }
  return local_4;
}

Assistant:

int EVP_PKEY_CTX_set_dh_paramgen_subprime_len(EVP_PKEY_CTX *ctx, int qbits)
{
    int ret;
    OSSL_PARAM params[2], *p = params;
    size_t bits2 = qbits;

    if ((ret = dh_paramgen_check(ctx)) <= 0)
        return ret;

    *p++ = OSSL_PARAM_construct_size_t(OSSL_PKEY_PARAM_FFC_QBITS, &bits2);
    *p = OSSL_PARAM_construct_end();

    return evp_pkey_ctx_set_params_strict(ctx, params);
}